

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorManager.cpp
# Opt level: O0

shared_ptr<Detector> __thiscall
DetectorManager::createDetector(DetectorManager *this,string *detectorName)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Detector> *in_RDI;
  shared_ptr<Detector> sVar5;
  shared_ptr<Detector> detector;
  shared_ptr<DetectorManager::DetectorLauncherInterface> *detectorLauncher;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  *in_stack_ffffffffffffff98;
  shared_ptr<Detector> *this_00;
  __shared_ptr local_40 [16];
  shared_ptr<DetectorManager::DetectorLauncherInterface> *local_30;
  _Self local_28;
  _Self local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x142a84);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::operator==(&local_28,local_20);
  if (bVar1) {
    std::shared_ptr<Detector>::shared_ptr(this_00,in_stack_ffffffffffffff98);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
                           *)0x142aca);
    local_30 = &ppVar2->second;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<DetectorManager::DetectorLauncherInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DetectorManager::DetectorLauncherInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x142afb);
      (*peVar3->_vptr_DetectorLauncherInterface[2])();
      std::shared_ptr<Detector>::shared_ptr<Detector,void>
                (this_00,(Detector *)in_stack_ffffffffffffff98);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
      if (bVar1) {
        std::shared_ptr<Detector>::shared_ptr
                  (this_00,(shared_ptr<Detector> *)in_stack_ffffffffffffff98);
      }
      else {
        std::shared_ptr<Detector>::shared_ptr(this_00,in_stack_ffffffffffffff98);
      }
      std::shared_ptr<Detector>::~shared_ptr((shared_ptr<Detector> *)0x142b58);
      _Var4._M_pi = extraout_RDX_01;
    }
    else {
      std::shared_ptr<Detector>::shared_ptr(this_00,in_stack_ffffffffffffff98);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  sVar5.super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<Detector>)sVar5.super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Detector> DetectorManager::createDetector(const std::string& detectorName) 
{
	auto it = m_detectors.find(detectorName);
	if (m_detectors.end() == it) 
	{
		return nullptr;
	}

	auto& detectorLauncher = it->second;
	if (!detectorLauncher) 
	{
		return nullptr;
	}

	auto detector = std::shared_ptr<Detector>(detectorLauncher->create());
	if (!detector) 
	{
		return nullptr;
	}

	return detector;
}